

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::setAddress(QHostAddress *this,quint8 *ip6Addr)

{
  QExplicitlySharedDataPointer<QHostAddressPrivate> *in_RSI;
  quint8 *in_RDI;
  QHostAddressPrivate *unaff_retaddr;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(in_RSI);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216ce9);
  QHostAddressPrivate::setAddress(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void QHostAddress::setAddress(const quint8 *ip6Addr)
{
    d.detach();
    d->setAddress(ip6Addr);
}